

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_rust_punycode.cc
# Opt level: O0

Nullable<char_*> absl::debugging_internal::DecodeRustPunycode(DecodeRustPunycodeOptions options)

{
  bool bVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  Utf8ForCodePoint in_stack_00000008;
  uint32_t n_index;
  Utf8ForCodePoint utf8_for_code_point;
  uint32_t delta;
  uint32_t old_i;
  BoundedUtf8LengthSequence<256U> utf8_lengths;
  uint32_t total_utf8_bytes;
  uint32_t num_chars;
  uint32_t bias;
  uint32_t i;
  uint32_t n;
  size_t out_size;
  char *out_end;
  char *out_begin;
  char *punycode_end;
  char *punycode_begin;
  char in_stack_ffffffffffffff68 [4];
  uint in_stack_ffffffffffffff6c;
  uint in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  uint32_t in_stack_ffffffffffffff7c;
  char *in_stack_ffffffffffffff80;
  char **in_stack_ffffffffffffff88;
  uint32_t in_stack_ffffffffffffffa8;
  uint32_t in_stack_ffffffffffffffac;
  BoundedUtf8LengthSequence<256U> *in_stack_ffffffffffffffb0;
  uint local_44;
  uint local_40;
  uint local_38;
  uint local_34;
  Nullable<char_*> local_8;
  
  if ((undefined1 *)utf8_lengths.rep_[0] == _delta) {
    local_8 = (Nullable<char_*>)0x0;
  }
  else {
    *_delta = 0;
    local_34 = 0x80;
    local_38 = 0;
    local_40 = 0;
    bVar1 = anon_unknown_0::ConsumeOptionalAsciiPrefix
                      (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                       (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                       (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       (uint32_t *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (bVar1) {
      local_44 = 0;
      BoundedUtf8LengthSequence<256U>::BoundedUtf8LengthSequence
                ((BoundedUtf8LengthSequence<256U> *)&stack0xffffffffffffff78);
      while (in_stack_00000008 != utf8_for_code_point) {
        if (0xff < local_40) {
          return (Nullable<char_*>)0x0;
        }
        uVar4 = local_38;
        bVar1 = anon_unknown_0::ScanNextDelta
                          (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                           in_stack_ffffffffffffff7c,
                           (uint32_t *)CONCAT44(local_38,in_stack_ffffffffffffff70));
        if (!bVar1) {
          return (Nullable<char_*>)0x0;
        }
        uVar2 = 2;
        if (uVar4 == 0) {
          uVar2 = 700;
        }
        uVar2 = (local_38 - uVar4) / uVar2;
        for (in_stack_ffffffffffffff70 = uVar2 / (local_40 + 1) + uVar2;
            0x1c7 < in_stack_ffffffffffffff70;
            in_stack_ffffffffffffff70 = in_stack_ffffffffffffff70 / 0x23) {
        }
        local_34 = local_38 / (local_40 + 1) + local_34;
        uVar4 = local_40 + 1;
        Utf8ForCodePoint::Utf8ForCodePoint
                  ((Utf8ForCodePoint *)&stack0xffffffffffffff68,(ulong)local_34);
        bVar1 = Utf8ForCodePoint::ok((Utf8ForCodePoint *)&stack0xffffffffffffff68);
        if (!bVar1) {
          return (Nullable<char_*>)0x0;
        }
        if (utf8_lengths.rep_[0] - (long)_delta < (ulong)(local_44 + in_stack_ffffffffffffff6c + 1))
        {
          return (Nullable<char_*>)0x0;
        }
        uVar3 = BoundedUtf8LengthSequence<256U>::InsertAndReturnSumOfPredecessors
                          (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                           in_stack_ffffffffffffffa8);
        memmove(_delta + (ulong)in_stack_ffffffffffffff6c + (ulong)uVar3,_delta + uVar3,
                (ulong)((local_44 + 1) - uVar3));
        memcpy(_delta + uVar3,&stack0xffffffffffffff68,(ulong)in_stack_ffffffffffffff6c);
        local_44 = in_stack_ffffffffffffff6c + local_44;
        local_40 = local_40 + 1;
        local_38 = local_38 % uVar4 + 1;
      }
      local_8 = _delta + local_44;
    }
    else {
      local_8 = (Nullable<char_*>)0x0;
    }
  }
  return local_8;
}

Assistant:

absl::Nullable<char*> DecodeRustPunycode(DecodeRustPunycodeOptions options) {
  const char* punycode_begin = options.punycode_begin;
  const char* const punycode_end = options.punycode_end;
  char* const out_begin = options.out_begin;
  char* const out_end = options.out_end;

  // Write a NUL terminator first.  Later memcpy calls will keep bumping it
  // along to its new right place.
  const size_t out_size = static_cast<size_t>(out_end - out_begin);
  if (out_size == 0) return nullptr;
  *out_begin = '\0';

  // RFC 3492 section 6.2 begins here.  We retain the names of integer variables
  // appearing in that text.
  uint32_t n = 128, i = 0, bias = 72, num_chars = 0;

  // If there are any ASCII characters, consume them and their trailing
  // underscore delimiter.
  if (!ConsumeOptionalAsciiPrefix(punycode_begin, punycode_end,
                                  out_begin, out_end, num_chars)) {
    return nullptr;
  }
  uint32_t total_utf8_bytes = num_chars;

  BoundedUtf8LengthSequence<kMaxChars> utf8_lengths;

  // "while the input is not exhausted do begin ... end"
  while (punycode_begin != punycode_end) {
    if (num_chars >= kMaxChars) return nullptr;

    const uint32_t old_i = i;

    if (!ScanNextDelta(punycode_begin, punycode_end, bias, i)) return nullptr;

    // Update bias as in RFC 3492 section 6.1.  (We have inlined adapt.)
    uint32_t delta = i - old_i;
    delta /= (old_i == 0 ? kDamp : 2);
    delta += delta/(num_chars + 1);
    bias = 0;
    while (delta > ((kBase - kTMin) * kTMax)/2) {
      delta /= kBase - kTMin;
      bias += kBase;
    }
    bias += ((kBase - kTMin + 1) * delta)/(delta + kSkew);

    // Back in section 6.2, compute the new code point and insertion index.
    static_assert(
        kMaxI + kMaxCodePoint < (uint64_t{1} << 32),
        "Make kMaxI smaller or n 64 bits wide to prevent silent wraparound");
    n += i/(num_chars + 1);
    i %= num_chars + 1;

    // To actually insert, we need to convert the code point n to UTF-8 and the
    // character index i to an index into the byte stream emitted so far.  First
    // prepare the UTF-8 encoding for n, rejecting surrogates, overlarge values,
    // and anything that won't fit into the remaining output storage.
    Utf8ForCodePoint utf8_for_code_point(n);
    if (!utf8_for_code_point.ok()) return nullptr;
    if (total_utf8_bytes + utf8_for_code_point.length + 1 > out_size) {
      return nullptr;
    }

    // Now insert the new character into both our length map and the output.
    uint32_t n_index =
        utf8_lengths.InsertAndReturnSumOfPredecessors(
            i, utf8_for_code_point.length);
    std::memmove(
        out_begin + n_index + utf8_for_code_point.length, out_begin + n_index,
        total_utf8_bytes + 1 - n_index);
    std::memcpy(out_begin + n_index, utf8_for_code_point.bytes,
                utf8_for_code_point.length);
    total_utf8_bytes += utf8_for_code_point.length;
    ++num_chars;

    // Finally, advance to the next state before continuing.
    ++i;
  }

  return out_begin + total_utf8_bytes;
}